

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem-C-API.cpp
# Opt level: O3

llb_buildsystem_t *
llb_buildsystem_create(llb_buildsystem_delegate_t delegate,llb_buildsystem_invocation_t invocation)

{
  char *pcVar1;
  long *plVar2;
  _func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_data_t_ptr *p_Var3;
  undefined2 uVar4;
  undefined4 uVar5;
  llb_quality_of_service_t level;
  llb_buildsystem_t *__dest;
  OptionalStorage<llbuild::basic::QualityOfService,_true> OVar6;
  BuildSystemFrontendDelegate *this;
  FileSystem *pFVar7;
  BuildSystemFrontend *this_00;
  _func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_command_result_t *__s;
  _func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_data_t_ptr *__s_00;
  _func_void_void_ptr_llb_buildsystem_command_t_ptr_char_ptr_llb_buildsystem_discovered_dependency_kind_t
  *__s_01;
  StringRef name;
  long in_stack_00000048;
  long in_stack_00000070;
  long in_stack_00000078;
  _Head_base<0UL,_llbuild::basic::FileSystem_*,_false> local_38;
  
  if (in_stack_00000048 == 0) {
    __assert_fail("delegate.handle_diagnostic",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x4fc,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (in_stack_00000070 == 0) {
    __assert_fail("delegate.command_started",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x4fd,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (in_stack_00000078 == 0) {
    __assert_fail("delegate.command_finished",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x4fe,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (delegate.context == (void *)0x0) {
    __assert_fail("delegate.command_found_discovered_dependency",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x4ff,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (delegate.lookup_tool == (_func_llb_buildsystem_tool_t_ptr_void_ptr_llb_data_t_ptr *)0x0) {
    __assert_fail("delegate.command_process_started",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x500,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (delegate.handle_diagnostic ==
      (_func_void_void_ptr_llb_buildsystem_diagnostic_kind_t_char_ptr_int_int_char_ptr *)0x0) {
    __assert_fail("delegate.command_process_had_error",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x501,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (delegate.had_command_failure == (_func_void_void_ptr *)0x0) {
    __assert_fail("delegate.command_process_had_output",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                  ,0x502,
                  "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
                 );
  }
  if (delegate.command_status_changed !=
      (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_command_status_kind_t *)0x0
     ) {
    __dest = (llb_buildsystem_t *)operator_new(0x1f8);
    level = delegate.command_cannot_build_output_due_to_missing_inputs._4_4_;
    uVar5 = delegate.command_cannot_build_output_due_to_missing_inputs._0_4_;
    uVar4 = delegate.command_had_warning._0_2_;
    p_Var3 = delegate.command_had_note;
    __s_00 = delegate.command_had_error;
    __s_01 = delegate.command_found_discovered_dependency;
    __s = delegate.command_finished;
    memcpy(__dest,&stack0x00000008,0xe8);
    *(undefined4 *)(__dest + 0xe8) = 0;
    *(llb_buildsystem_t **)(__dest + 0xf0) = __dest + 0x100;
    *(undefined8 *)(__dest + 0x100) = 0x62642e646c697562;
    *(undefined8 *)(__dest + 0xf8) = 8;
    __dest[0x108] = (llb_buildsystem_t)0x0;
    *(llb_buildsystem_t **)(__dest + 0x110) = __dest + 0x120;
    *(undefined8 *)(__dest + 0x118) = 0;
    __dest[0x120] = (llb_buildsystem_t)0x0;
    *(llb_buildsystem_t **)(__dest + 0x130) = __dest + 0x140;
    *(undefined8 *)(__dest + 0x140) = 0x6c6c2e646c697562;
    *(undefined8 *)(__dest + 0x145) = 0x646c6975626c6c2e;
    *(undefined8 *)(__dest + 0x138) = 0xd;
    __dest[0x14d] = (llb_buildsystem_t)0x0;
    *(llb_buildsystem_t **)(__dest + 0x150) = __dest + 0x160;
    *(undefined8 *)(__dest + 0x158) = 0;
    __dest[0x160] = (llb_buildsystem_t)0x0;
    *(undefined8 *)(__dest + 0x170) = 0;
    __dest[0x17c] = (llb_buildsystem_t)0x0;
    __dest[0x1a0] = (llb_buildsystem_t)0x0;
    *(undefined8 *)(__dest + 400) = 0;
    *(undefined8 *)(__dest + 0x198) = 0;
    *(undefined8 *)(__dest + 0x180) = 0;
    *(undefined8 *)(__dest + 0x188) = 0;
    *(undefined8 *)(__dest + 0x1a8) = 0;
    *(undefined8 *)(__dest + 0x1b0) = 0;
    *(undefined8 *)(__dest + 0x1b8) = 0;
    *(undefined8 *)(__dest + 0x1c0) = 0;
    *(undefined8 *)(__dest + 0x1c8) = 0;
    *(undefined8 *)(__dest + 0x1d0) = 0;
    *(undefined8 *)(__dest + 0x1d8) = 0;
    *(undefined8 *)(__dest + 0x1e0) = 0;
    *(undefined8 *)(__dest + 0x1e8) = 0;
    *(undefined8 *)(__dest + 0x1f0) = 0;
    if (__s == (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_command_result_t *
               )0x0) {
      __s = (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_buildsystem_command_result_t *)
            0x1fac2f;
    }
    strlen((char *)__s);
    std::__cxx11::string::_M_replace((ulong)(__dest + 0x130),0,(char *)0xd,(ulong)__s);
    if (__s_01 == (_func_void_void_ptr_llb_buildsystem_command_t_ptr_char_ptr_llb_buildsystem_discovered_dependency_kind_t
                   *)0x0) {
      __s_01 = (_func_void_void_ptr_llb_buildsystem_command_t_ptr_char_ptr_llb_buildsystem_discovered_dependency_kind_t
                *)0x1fac2f;
    }
    pcVar1 = *(char **)(__dest + 0xf8);
    strlen((char *)__s_01);
    std::__cxx11::string::_M_replace((ulong)(__dest + 0xf0),0,pcVar1,(ulong)__s_01);
    if (__s_00 == (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_data_t_ptr *)0x0) {
      __s_00 = (_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_data_t_ptr *)0x1fac2f;
    }
    pcVar1 = *(char **)(__dest + 0x158);
    strlen((char *)__s_00);
    std::__cxx11::string::_M_replace((ulong)(__dest + 0x150),0,pcVar1,(ulong)__s_00);
    *(_func_void_void_ptr_llb_buildsystem_command_t_ptr_llb_data_t_ptr **)(__dest + 0x180) = p_Var3;
    *(undefined2 *)(__dest + 0xea) = uVar4;
    *(undefined4 *)(__dest + 0x174) = uVar5;
    OVar6 = (OptionalStorage<llbuild::basic::QualityOfService,_true>)getQoSFromLLBQoS(level);
    *(OptionalStorage<llbuild::basic::QualityOfService,_true> *)(__dest + 0x178) = OVar6;
    *(code **)(__dest + 0x1d8) =
         (anonymous_namespace)::CAPIBuildSystem::
         CAPIBuildSystem(llb_buildsystem_delegate_t_,llb_buildsystem_invocation_t_)::
         {lambda(llvm::SMDiagnostic_const&,void*)#1}::SMDiagnostic_const__void__;
    *(llb_buildsystem_t **)(__dest + 0x1e0) = __dest;
    this = (BuildSystemFrontendDelegate *)operator_new(0x120);
    name.Length = 5;
    name.Data = "basic";
    llbuild::buildsystem::BuildSystemFrontendDelegate::BuildSystemFrontendDelegate
              (this,(SourceMgr *)(__dest + 0x1a8),name,0);
    (this->super_BuildSystemDelegate)._vptr_BuildSystemDelegate =
         (_func_int **)&PTR__BuildSystemFrontendDelegate_0023af80;
    memcpy(this + 1,&stack0x00000008,0xe8);
    plVar2 = *(long **)(__dest + 0x1e8);
    *(BuildSystemFrontendDelegate **)(__dest + 0x1e8) = this;
    if (plVar2 != (long *)0x0) {
      (**(code **)(*plVar2 + 8))();
    }
    pFVar7 = (FileSystem *)operator_new(0xf8);
    memcpy(pFVar7 + 1,&stack0x00000008,0xe8);
    pFVar7->_vptr_FileSystem = (_func_int **)&PTR__CAPIFileSystem_0023b078;
    llbuild::basic::createLocalFileSystem();
    this_00 = (BuildSystemFrontend *)operator_new(8);
    local_38._M_head_impl = pFVar7;
    llbuild::buildsystem::BuildSystemFrontend::BuildSystemFrontend
              (this_00,*(BuildSystemFrontendDelegate **)(__dest + 0x1e8),
               (BuildSystemInvocation *)(__dest + 0xe8),
               (unique_ptr<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
                *)&local_38);
    std::
    __uniq_ptr_impl<llbuild::buildsystem::BuildSystemFrontend,_std::default_delete<llbuild::buildsystem::BuildSystemFrontend>_>
    ::reset((__uniq_ptr_impl<llbuild::buildsystem::BuildSystemFrontend,_std::default_delete<llbuild::buildsystem::BuildSystemFrontend>_>
             *)(__dest + 0x1f0),this_00);
    if (local_38._M_head_impl != (FileSystem *)0x0) {
      (*(local_38._M_head_impl)->_vptr_FileSystem[1])();
    }
    return __dest;
  }
  __assert_fail("delegate.command_process_finished",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/products/libllbuild/BuildSystem-C-API.cpp"
                ,0x503,
                "llb_buildsystem_t *llb_buildsystem_create(llb_buildsystem_delegate_t, llb_buildsystem_invocation_t)"
               );
}

Assistant:

llb_buildsystem_t* llb_buildsystem_create(
    llb_buildsystem_delegate_t delegate,
    llb_buildsystem_invocation_t invocation) {
  // Check that all required methods are provided.
  assert(delegate.handle_diagnostic);
  assert(delegate.command_started);
  assert(delegate.command_finished);
  assert(delegate.command_found_discovered_dependency);
  assert(delegate.command_process_started);
  assert(delegate.command_process_had_error);
  assert(delegate.command_process_had_output);
  assert(delegate.command_process_finished);
         
  return (llb_buildsystem_t*) new CAPIBuildSystem(delegate, invocation);
}